

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mid2svg.cpp
# Opt level: O1

void drawRound3(ostream *out,double x,double y,double width,double height)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = x + width;
  dVar6 = height * 0.5;
  dVar3 = width * 0.5;
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"",0x30);
  std::__ostream_insert<char,std::char_traits<char>>(out," M ",3);
  poVar1 = std::ostream::_M_insert<double>(x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  dVar4 = dVar6 + y;
  std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(out," L ",3);
  poVar1 = std::ostream::_M_insert<double>(x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(out," A ",3);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," 0 0 0 ",7);
  poVar1 = std::ostream::_M_insert<double>(dVar3 + x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(y + height);
  std::__ostream_insert<char,std::char_traits<char>>(out," L ",3);
  dVar5 = dVar2 - dVar3;
  poVar1 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(y + height);
  std::__ostream_insert<char,std::char_traits<char>>(out," A ",3);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," 0 0 0 ",7);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(out," L ",3);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(out," L ",3);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(out," A ",3);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," 0 0 1 ",7);
  poVar1 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(y);
  std::__ostream_insert<char,std::char_traits<char>>(out," L ",3);
  poVar1 = std::ostream::_M_insert<double>(dVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(y);
  std::__ostream_insert<char,std::char_traits<char>>(out," L ",3);
  poVar1 = std::ostream::_M_insert<double>(dVar3 + x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(y);
  std::__ostream_insert<char,std::char_traits<char>>(out," A ",3);
  poVar1 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," 0 0 0 ",7);
  poVar1 = std::ostream::_M_insert<double>(x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>(dVar4);
  std::__ostream_insert<char,std::char_traits<char>>(out," z\"",3);
  std::__ostream_insert<char,std::char_traits<char>>(out,"/>\n",3);
  return;
}

Assistant:

void drawRound3(ostream& out, double x, double y, double width, double height) {
	double& h = height;
	double& w = width;
	double x2 = x+w;
	double y2 = y+h;
	double m  = h/2.0;
	double d  = w/2.0;
	double Rx  = d;
	double Ry  = h/2;

	out << "\t\t\t\t<path vector-effect=\"non-scaling-stroke\" d=\"";
	out << " M " << x          << " " << y+m;
	out << " L " << x           << " " << y+m;
	out << " A " << Rx << " " << Ry << " 0 0 0 " << x+d << " " << y2;
	out << " L " << x2-d        << " " << y2;
	out << " A " << Rx << " " << Ry << " 0 0 0 " << x2 << " " << y+m;
	out << " L " << x2          << " " << y+m;
	out << " L " << x2          << " " << y+m;
	out << " A " << Rx << " " << Ry << " 0 0 1 " << x2-d << " " << y;
	out << " L " << x2-d        << " " << y;
	out << " L " << x+d         << " " << y;
	out << " A " << Rx << " " << Ry << " 0 0 0 " << x << " " << y+m;
	out << " z\"";
	out << "/>\n";
}